

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

Compressor *
Imf_3_3::newTileCompressor(Compression c,size_t tileLineSize,size_t numTileLines,Header *hdr)

{
  exr_storage_t eVar1;
  undefined4 in_EDI;
  Compressor *ret;
  AcCompression in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  size_t in_stack_ffffffffffffff70;
  Header *in_stack_ffffffffffffff78;
  RleCompressor *in_stack_ffffffffffffff80;
  unsigned_long in_stack_ffffffffffffff88;
  unsigned_long in_stack_ffffffffffffff90;
  Compressor *local_28;
  
  local_28 = (Compressor *)0x0;
  switch(in_EDI) {
  case 1:
    local_28 = (Compressor *)operator_new(0x458);
    uiMult<unsigned_long>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    RleCompressor::RleCompressor
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    break;
  case 2:
  case 3:
    local_28 = (Compressor *)operator_new(0x458);
    ZipCompressor::ZipCompressor
              ((ZipCompressor *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    break;
  case 4:
    local_28 = (Compressor *)operator_new(0x458);
    PizCompressor::PizCompressor
              ((PizCompressor *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    break;
  case 5:
    local_28 = (Compressor *)operator_new(0x458);
    Pxr24Compressor::Pxr24Compressor
              ((Pxr24Compressor *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    break;
  case 6:
    local_28 = (Compressor *)operator_new(0x458);
    B44Compressor::B44Compressor
              ((B44Compressor *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               SUB41(in_stack_ffffffffffffff68 >> 0x18,0));
    break;
  case 7:
    local_28 = (Compressor *)operator_new(0x458);
    B44Compressor::B44Compressor
              ((B44Compressor *)local_28,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,SUB41(in_stack_ffffffffffffff68 >> 0x18,0));
    break;
  case 8:
    local_28 = (Compressor *)operator_new(0x458);
    DwaCompressor::DwaCompressor
              ((DwaCompressor *)in_stack_ffffffffffffff80,(Header *)local_28,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    break;
  case 9:
    local_28 = (Compressor *)operator_new(0x458);
    DwaCompressor::DwaCompressor
              ((DwaCompressor *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)local_28
               ,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  }
  if ((local_28 != (Compressor *)0x0) &&
     (eVar1 = Compressor::storageType(local_28), eVar1 == EXR_STORAGE_LAST_TYPE)) {
    Compressor::setStorageType(local_28,EXR_STORAGE_TILED);
  }
  return local_28;
}

Assistant:

Compressor*
newTileCompressor (
    Compression c, size_t tileLineSize, size_t numTileLines, const Header& hdr)
{
    Compressor* ret = nullptr;
    // clang-format off
    switch (c)
    {
        case RLE_COMPRESSION:

            ret = new RleCompressor (hdr, uiMult (tileLineSize, numTileLines));
            break;

        case ZIPS_COMPRESSION:
        case ZIP_COMPRESSION:

            ret = new ZipCompressor (hdr, tileLineSize, numTileLines);
            break;

        case PIZ_COMPRESSION:

            ret = new PizCompressor (hdr, tileLineSize, numTileLines);
            break;

        case PXR24_COMPRESSION:

            ret = new Pxr24Compressor (hdr, tileLineSize, numTileLines);
            break;

        case B44_COMPRESSION:

            ret = new B44Compressor (hdr, tileLineSize, numTileLines, false);
            break;

        case B44A_COMPRESSION:

            ret = new B44Compressor (hdr, tileLineSize, numTileLines, true);
            break;

        case DWAA_COMPRESSION:

            ret = new DwaCompressor (
                hdr,
                static_cast<int> (tileLineSize),
                static_cast<int> (numTileLines),
                DwaCompressor::DEFLATE);
            break;

        case DWAB_COMPRESSION:

            ret = new DwaCompressor (
                hdr,
                static_cast<int> (tileLineSize),
                static_cast<int> (numTileLines),
                DwaCompressor::STATIC_HUFFMAN);
            break;

        default: break;
    }
    // clang-format on

    if (ret && ret->storageType () == EXR_STORAGE_LAST_TYPE)
        ret->setStorageType (EXR_STORAGE_TILED);

    return ret;
}